

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QTransform>::reallocateAndGrow
          (QArrayDataPointer<QTransform> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTransform> *old)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  QTransform *pQVar3;
  long lVar4;
  QTransform *pQVar5;
  QTransform *pQVar6;
  QTransform *pQVar7;
  QTransform *data;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  undefined1 auVar10 [16];
  QArrayDataPointer<QTransform> local_38;
  long local_20;
  
  bVar9 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QTransform> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar10 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,0x50,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                         -0x3333333333333333,Grow);
    this->d = (Data *)auVar10._0_8_;
    this->ptr = (QTransform *)auVar10._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar4 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QTransform> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar4) {
          pQVar3 = this->ptr;
          pQVar8 = pQVar3 + lVar4;
          pQVar5 = local_38.ptr + local_38.size;
          do {
            pQVar6 = pQVar3;
            pQVar7 = pQVar5;
            for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
              pQVar7->m_matrix[0][0] = pQVar6->m_matrix[0][0];
              pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
              pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
            }
            pQVar3 = pQVar3 + 1;
            local_38.size = local_38.size + 1;
            pQVar5 = pQVar5 + 1;
          } while (pQVar3 < pQVar8);
        }
      }
      else if (0 < lVar4) {
        pQVar3 = this->ptr;
        pQVar8 = pQVar3 + lVar4;
        pQVar5 = local_38.ptr + local_38.size;
        do {
          pQVar6 = pQVar3;
          pQVar7 = pQVar5;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            pQVar7->m_matrix[0][0] = pQVar6->m_matrix[0][0];
            pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
            pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          }
          pQVar3 = pQVar3 + 1;
          local_38.size = local_38.size + 1;
          pQVar5 = pQVar5 + 1;
        } while (pQVar3 < pQVar8);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    this->d = local_38.d;
    pQVar3 = this->ptr;
    this->ptr = local_38.ptr;
    qVar2 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = pQVar3;
    local_38.size = qVar2;
    if (old != (QArrayDataPointer<QTransform> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = pQVar3;
      local_38.size = old->size;
      old->size = qVar2;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x50,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }